

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O1

CHUNKcode Curl_httpchunk_read(Curl_easy *data,char *datap,ssize_t datalen,ssize_t *wrote,
                             CURLcode *extrap)

{
  Curl_chunker *num;
  char *str;
  dynbuf *s;
  byte bVar1;
  byte bVar2;
  connectdata *pcVar3;
  contenc_writer *writer;
  connectdata *pcVar4;
  bool bVar5;
  CURLcode CVar6;
  CURLofft CVar7;
  char *pcVar8;
  size_t sVar9;
  ulong uVar10;
  long sonum;
  int iVar11;
  char *endptr;
  CHUNKcode local_6c;
  char *local_38;
  
  pcVar3 = data->conn;
  *wrote = 0;
  if (((((data->set).field_0x8e6 & 4) != 0) && (((data->req).field_0xd9 & 8) == 0)) &&
     (CVar6 = Curl_client_write(data,1,datap,datalen), CVar6 != CURLE_OK)) {
    *extrap = CVar6;
    return CHUNKE_PASSTHRU_ERROR;
  }
  if (datalen != 0) {
    num = &pcVar3->chunk;
    s = &pcVar3->trailer;
    str = (pcVar3->chunk).hexbuffer;
    do {
      switch((pcVar3->chunk).state) {
      case CHUNK_HEX:
        bVar2 = *datap;
        if (((byte)(bVar2 - 0x30) < 10) ||
           ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0))))
        {
          bVar1 = (pcVar3->chunk).hexindex;
          if (0xf < (ulong)bVar1) {
            return CHUNKE_TOO_LONG_HEX;
          }
          (pcVar3->chunk).hexbuffer[bVar1] = bVar2;
          datap = (char *)((byte *)datap + 1);
          datalen = datalen + -1;
          (pcVar3->chunk).hexindex = bVar1 + 1;
        }
        else {
          uVar10 = (ulong)(pcVar3->chunk).hexindex;
          if (uVar10 == 0) {
LAB_00612c4f:
            bVar5 = false;
            local_6c = CHUNKE_ILLEGAL_HEX;
          }
          else {
            str[uVar10] = '\0';
            CVar7 = curlx_strtoofft(str,&local_38,0x10,&num->datasize);
            if (CVar7 != CURL_OFFT_OK) goto LAB_00612c4f;
            (pcVar3->chunk).state = CHUNK_LF;
            bVar5 = true;
          }
          if (!bVar5) {
            return local_6c;
          }
        }
        break;
      case CHUNK_LF:
        if (*datap == 10) {
          (pcVar3->chunk).state = (uint)((pcVar3->chunk).datasize == 0) * 3 + CHUNK_DATA;
        }
        goto LAB_00612c0c;
      case CHUNK_DATA:
        sonum = num->datasize;
        if (datalen <= num->datasize) {
          sonum = datalen;
        }
        sVar9 = curlx_sotouz(sonum);
        uVar10 = *(ulong *)&(data->set).field_0x8e2;
        if (((uVar10 & 0x400000000) == 0) && (((data->req).field_0xd9 & 8) == 0)) {
          if (((uVar10 >> 0x23 & 1) == 0) &&
             (writer = (data->req).writer_stack, writer != (contenc_writer *)0x0)) {
            CVar6 = Curl_unencode_write(data,writer,datap,sVar9);
          }
          else {
            CVar6 = Curl_client_write(data,1,datap,sVar9);
          }
          if (CVar6 != CURLE_OK) {
            *extrap = CVar6;
            return CHUNKE_PASSTHRU_ERROR;
          }
        }
        *wrote = *wrote + sVar9;
        datap = (char *)((byte *)datap + sVar9);
        datalen = datalen - sVar9;
        num->datasize = num->datasize - sVar9;
        if (num->datasize == 0) {
          (pcVar3->chunk).state = CHUNK_POSTLF;
        }
        break;
      case CHUNK_POSTLF:
        if (*datap != 0xd) {
          if (*datap != 10) {
            return CHUNKE_BAD_CHUNK;
          }
          pcVar4 = data->conn;
          (pcVar4->chunk).hexindex = '\0';
          (pcVar4->chunk).state = CHUNK_HEX;
          Curl_dyn_init(&pcVar4->trailer,0x1000);
        }
        goto LAB_00612c0c;
      case CHUNK_STOP:
        if (*datap == 10) {
          sVar9 = curlx_sotouz(datalen + -1);
          num->datasize = sVar9;
          return CHUNKE_STOP;
        }
        return CHUNKE_BAD_CHUNK;
      case CHUNK_TRAILER:
        if ((*datap == 0xd) || (*datap == 10)) {
          pcVar8 = Curl_dyn_ptr(s);
          if (pcVar8 == (char *)0x0) {
            (pcVar3->chunk).state = CHUNK_TRAILER_POSTCR;
            iVar11 = 4;
          }
          else {
            CVar6 = Curl_dyn_addn(s,"\r\n",2);
            iVar11 = 1;
            if (CVar6 == CURLE_OK) {
              pcVar8 = Curl_dyn_ptr(s);
              sVar9 = Curl_dyn_len(s);
              if (((*(ulong *)&(data->set).field_0x8e2 & 0x400000000) == 0) &&
                 (CVar6 = Curl_client_write(data,0x22,pcVar8,sVar9), CVar6 != CURLE_OK)) {
                *extrap = CVar6;
                local_6c = CHUNKE_PASSTHRU_ERROR;
              }
              else {
                Curl_dyn_reset(s);
                (pcVar3->chunk).state = CHUNK_TRAILER_CR;
                iVar11 = (uint)(*datap == 10) << 2;
              }
            }
            else {
              local_6c = CHUNKE_OUT_OF_MEMORY;
            }
          }
          if (iVar11 != 0) {
            if (iVar11 != 4) {
              return local_6c;
            }
            break;
          }
        }
        else {
          CVar6 = Curl_dyn_addn(s,datap,1);
          if (CVar6 != CURLE_OK) {
            return CHUNKE_OUT_OF_MEMORY;
          }
        }
        goto LAB_00612c0c;
      case CHUNK_TRAILER_CR:
        if (*datap != 10) {
          return CHUNKE_BAD_CHUNK;
        }
        (pcVar3->chunk).state = CHUNK_TRAILER_POSTCR;
LAB_00612c0c:
        datap = (char *)((byte *)datap + 1);
        datalen = datalen + -1;
        break;
      case CHUNK_TRAILER_POSTCR:
        bVar2 = *datap;
        if ((bVar2 == 10) || (bVar2 == 0xd)) {
          datap = (char *)((byte *)datap + (bVar2 == 0xd));
          datalen = datalen - (ulong)(bVar2 == 0xd);
          (pcVar3->chunk).state = CHUNK_STOP;
        }
        else {
          (pcVar3->chunk).state = CHUNK_TRAILER;
        }
      }
    } while (datalen != 0);
  }
  return CHUNKE_OK;
}

Assistant:

CHUNKcode Curl_httpchunk_read(struct Curl_easy *data,
                              char *datap,
                              ssize_t datalen,
                              ssize_t *wrote,
                              CURLcode *extrap)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct Curl_chunker *ch = &conn->chunk;
  struct SingleRequest *k = &data->req;
  size_t piece;
  curl_off_t length = (curl_off_t)datalen;

  *wrote = 0; /* nothing's written yet */

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length*/
  if(data->set.http_te_skip && !k->ignorebody) {
    result = Curl_client_write(data, CLIENTWRITE_BODY, datap, datalen);
    if(result) {
      *extrap = result;
      return CHUNKE_PASSTHRU_ERROR;
    }
  }

  while(length) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(ISXDIGIT(*datap)) {
        if(ch->hexindex < CHUNK_MAXNUM_LEN) {
          ch->hexbuffer[ch->hexindex] = *datap;
          datap++;
          length--;
          ch->hexindex++;
        }
        else {
          return CHUNKE_TOO_LONG_HEX; /* longer hex than we support */
        }
      }
      else {
        char *endptr;
        if(0 == ch->hexindex)
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          return CHUNKE_ILLEGAL_HEX;

        /* length and datap are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;

        if(curlx_strtoofft(ch->hexbuffer, &endptr, 16, &ch->datasize))
          return CHUNKE_ILLEGAL_HEX;
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*datap == 0x0a) {
        /* we're now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
        }
        else
          ch->state = CHUNK_DATA;
      }

      datap++;
      length--;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'length' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = curlx_sotouz((ch->datasize >= length)?length:ch->datasize);

      /* Write the data portion available */
      if(!data->set.http_te_skip && !k->ignorebody) {
        if(!data->set.http_ce_skip && k->writer_stack)
          result = Curl_unencode_write(data, k->writer_stack, datap, piece);
        else
          result = Curl_client_write(data, CLIENTWRITE_BODY, datap, piece);

        if(result) {
          *extrap = result;
          return CHUNKE_PASSTHRU_ERROR;
        }
      }

      *wrote += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      datap += piece;    /* move read pointer forward */
      length -= piece;   /* decrease space left in this round */

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*datap == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_init(data); /* sets state back to CHUNK_HEX */
      }
      else if(*datap != 0x0d)
        return CHUNKE_BAD_CHUNK;
      datap++;
      length--;
      break;

    case CHUNK_TRAILER:
      if((*datap == 0x0d) || (*datap == 0x0a)) {
        char *tr = Curl_dyn_ptr(&conn->trailer);
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(tr) {
          size_t trlen;
          result = Curl_dyn_addn(&conn->trailer, (char *)STRCONST("\x0d\x0a"));
          if(result)
            return CHUNKE_OUT_OF_MEMORY;

          tr = Curl_dyn_ptr(&conn->trailer);
          trlen = Curl_dyn_len(&conn->trailer);
          if(!data->set.http_te_skip) {
            result = Curl_client_write(data,
                                       CLIENTWRITE_HEADER|CLIENTWRITE_TRAILER,
                                       tr, trlen);
            if(result) {
              *extrap = result;
              return CHUNKE_PASSTHRU_ERROR;
            }
          }
          Curl_dyn_reset(&conn->trailer);
          ch->state = CHUNK_TRAILER_CR;
          if(*datap == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we're on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* don't advance the pointer */
        }
      }
      else {
        result = Curl_dyn_addn(&conn->trailer, datap, 1);
        if(result)
          return CHUNKE_OUT_OF_MEMORY;
      }
      datap++;
      length--;
      break;

    case CHUNK_TRAILER_CR:
      if(*datap == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        datap++;
        length--;
      }
      else
        return CHUNKE_BAD_CHUNK;
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*datap != 0x0d) && (*datap != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*datap == 0x0d) {
        /* skip if CR */
        datap++;
        length--;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*datap == 0x0a) {
        length--;

        /* Record the length of any data left in the end of the buffer
           even if there's no more chunks to read */
        ch->datasize = curlx_sotouz(length);

        return CHUNKE_STOP; /* return stop */
      }
      else
        return CHUNKE_BAD_CHUNK;
    }
  }
  return CHUNKE_OK;
}